

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void kj::anon_unknown_70::validateExceptionPointer(ExceptionImpl *e)

{
  bool _kjCondition;
  Fault f;
  ExceptionImpl *e_local;
  
  _kjCondition = (ExceptionImpl *)0xfff < e || e == (ExceptionImpl *)0x0;
  if ((ExceptionImpl *)0xfff < e || e == (ExceptionImpl *)0x0) {
    return;
  }
  e_local = e;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[37],kj::ExceptionImpl_const*&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
             ,0x470,FAILED,"e == nullptr || reinterpret_cast<uintptr_t>(e) >= 4096",
             "_kjCondition,\"detected bogus ExceptionImpl pointer\", e",&_kjCondition,
             (char (*) [37])"detected bogus ExceptionImpl pointer",&e_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void validateExceptionPointer(const ExceptionImpl* e) noexcept {
  // Occasionally in production we are seeing `currentException` have the value 1. Try to figure
  // this out...
  KJ_ASSERT(e == nullptr || reinterpret_cast<uintptr_t>(e) >= 4096,
      "detected bogus ExceptionImpl pointer", e);
}